

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O1

void Am_Choice_List_Do_proc(Am_Object *inter)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Slot_Flags set_flags;
  Am_Object new_object;
  Am_Object ref_object;
  Am_Choice_How_Set how_set;
  Am_Value_List old_value_list;
  Am_Value old_value;
  Am_Input_Char ic;
  Am_Value_List new_value;
  Am_Object local_70;
  Am_Value_List local_68;
  Am_Object local_58;
  Am_Value_List local_50;
  Am_Value local_40;
  Am_Input_Char local_2c;
  Am_Value_List local_28;
  
  pAVar2 = Am_Object::Get(inter,0xd4,0);
  if ((pAVar2->type != 1) && (pAVar2->type != Am_Choice_How_Set::Am_Choice_How_Set_ID)) {
    Am_Choice_How_Set::TypeError((Am_Choice_How_Set *)&local_68.item,pAVar2);
  }
  local_68.item = *(Am_List_Item **)&pAVar2->value;
  pAVar2 = Am_Object::Get(inter,0x169,3);
  Am_Value::Am_Value(&local_40,pAVar2);
  Am_Value_List::Am_Value_List(&local_50);
  bVar1 = Am_Value_List::Test(&local_40);
  if (bVar1) {
    Am_Value_List::operator=(&local_50,&local_40);
  }
  else if (local_40.type == 0xa001) {
    Am_Value_List::Add(&local_50,&local_40,Am_TAIL,true);
  }
  pAVar2 = Am_Object::Get(inter,0x16a,0);
  Am_Object::Am_Object(&local_70,pAVar2);
  if (local_68.item == (Am_List_Item *)Am_CHOICE_LIST_TOGGLE.value) {
    pAVar2 = Am_Object::Get(inter,0x12e,0);
    Am_Object::Am_Object((Am_Object *)&local_68,pAVar2);
    pAVar2 = Am_Object::Get(inter,0x11b,0);
    Am_Input_Char::Am_Input_Char(&local_2c,pAVar2);
    bVar1 = Am_Object::Valid((Am_Object *)&local_68);
    if (bVar1) {
      bVar1 = Am_Object::Valid(&local_70);
      if (!bVar1) {
        pAVar2 = Am_Object::Get(inter,0x1ef,0);
        Am_Object::operator=(&local_70,pAVar2);
      }
    }
    else {
      Am_Object::operator=((Am_Object *)&local_68,&local_70);
    }
    list_final_value((Am_Object *)&local_28,inter,&local_70,&local_68,SUB81(&local_50,0));
    pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_28);
    Am_Object::Set(inter,0x169,pAVar3,1);
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&local_68);
    Am_Object::Set(inter,0x16d,pAVar3,1);
    Am_Value_List::~Am_Value_List(&local_28);
    Am_Object::~Am_Object((Am_Object *)&local_68);
    goto LAB_00232fe6;
  }
  Am_Object::Set(&local_70,0x173,false,1);
  Am_Value_List::Start(&local_50);
  if (local_68.item == (Am_List_Item *)Am_CHOICE_TOGGLE.value) {
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_70);
    bVar1 = Am_Value_List::Member(&local_50,pAVar3);
    if (!bVar1) goto LAB_00232ed5;
LAB_00232ee7:
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&Am_No_Object);
    set_flags = 0;
  }
  else {
LAB_00232ed5:
    if (local_68.item == (Am_List_Item *)Am_CHOICE_CLEAR.value) goto LAB_00232ee7;
    bVar1 = Am_Object::Valid(&local_70);
    if (bVar1) {
      Am_Object::Set(&local_70,0x172,true,1);
    }
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_70);
    set_flags = 1;
  }
  Am_Object::Set(inter,0x169,pAVar3,set_flags);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_70);
  Am_Object::Set(inter,0x16d,pAVar3,1);
LAB_00232fe6:
  Am_Object::Set(inter,0x16c,&local_40,1);
  Am_Object::Am_Object(&local_58,inter);
  Am_Copy_Values_To_Command(&local_58);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_70);
  Am_Value_List::~Am_Value_List(&local_50);
  Am_Value::~Am_Value(&local_40);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Choice_List_Do, (Am_Object inter))
{
  Am_Choice_How_Set how_set = inter.Get(Am_HOW_SET);
  Am_Value old_value = inter.Get(Am_VALUE, Am_RETURN_ZERO_ON_ERROR);
  Am_Value_List old_value_list;
  if (Am_Value_List::Test(old_value))
    old_value_list = old_value;
  else if (old_value.type == Am_OBJECT)
    old_value_list.Add(old_value);
  Am_Object new_object = inter.Get(Am_INTERIM_VALUE);
  if (how_set == Am_CHOICE_LIST_TOGGLE) {
    Am_Object ref_object = inter.Get(Am_INITIAL_REF_OBJECT);
    Am_Input_Char ic = inter.Get(Am_START_CHAR);
    bool separate_extend = ic.control;
    if (!ref_object.Valid())
      ref_object = new_object;
    else if (!new_object.Valid())
      new_object = inter.Get(Am_LAST_USED_OLD_INTERIM_VALUE);
    // clears interim value and sets new value
    Am_Value_List new_value = list_final_value(inter, new_object, ref_object,
                                               old_value_list, separate_extend);
    inter.Set(Am_VALUE, new_value, Am_OK_IF_NOT_THERE);
    inter.Set(Am_OBJECT_MODIFIED, ref_object, Am_OK_IF_NOT_THERE);
  } else {
    Am_REPORT_SET_SEL_VALUE(false, inter, new_object, false);
    new_object.Set(Am_INTERIM_SELECTED, false, Am_OK_IF_NOT_THERE);
    old_value_list.Start();
    if ((how_set == Am_CHOICE_TOGGLE && old_value_list.Member(new_object)) ||
        how_set == Am_CHOICE_CLEAR)
      inter.Set(Am_VALUE, Am_No_Object); // empty
    else {
      if (new_object.Valid()) {
        Am_REPORT_SET_SEL_VALUE(true, inter, new_object, true);
        new_object.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
      }
      inter.Set(Am_VALUE, new_object, Am_OK_IF_NOT_THERE);
    }
    inter.Set(Am_OBJECT_MODIFIED, new_object, Am_OK_IF_NOT_THERE);
  }
  inter.Set(Am_OLD_VALUE, old_value, Am_OK_IF_NOT_THERE);
  Am_Copy_Values_To_Command(inter);
}